

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O2

void CreateBackwardReferencesNH42
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command_conflict *commands,
               size_t *num_commands,size_t *num_literals,
               BackwardReferenceFromDecoder *backward_references,size_t *back_refs_position,
               size_t back_refs_size)

{
  ulong uVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  void *pvVar6;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  size_t sVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  BrotliTransforms *pBVar21;
  uint8_t *puVar22;
  byte bVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  char *pcVar28;
  short sVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  int iVar33;
  ulong uVar34;
  ulong uVar35;
  ushort uVar36;
  uint uVar37;
  ulong uVar38;
  long lVar39;
  ulong uVar40;
  long lVar41;
  size_t *psVar42;
  ulong uVar43;
  ulong uVar44;
  size_t sVar45;
  size_t *psVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  long lVar51;
  bool bVar52;
  bool bVar53;
  ulong uStack_190;
  ulong local_180;
  ulong local_170;
  ulong local_160;
  ulong local_138;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  size_t *local_b8;
  
  uVar16 = (1L << (literal_context_lut[8] & 0x3f)) - 0x10;
  uVar4 = (position - 3) + num_bytes;
  sVar45 = position;
  if (3 < num_bytes) {
    sVar45 = uVar4;
  }
  lVar10 = *(long *)(literal_context_lut + 0x10);
  lVar41 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    lVar41 = 0x40;
  }
  uVar47 = *(ulong *)dist_cache;
  pvVar6 = (hasher->common).extra;
  iVar15 = (int)pvVar6;
  iVar33 = (int)((ulong)pvVar6 >> 0x20);
  *(int *)&(hasher->common).dict_num_matches = iVar15 + -1;
  *(int *)((long)&(hasher->common).dict_num_matches + 4) = iVar15 + 1;
  (hasher->common).params.type = iVar15 + -2;
  (hasher->common).params.bucket_bits = iVar15 + 2;
  (hasher->common).params.block_bits = iVar15 + -3;
  (hasher->common).params.hash_len = iVar15 + 3;
  (hasher->common).params.num_last_distances_to_check = iVar33 + -1;
  (hasher->common).is_prepared_ = iVar33 + 1;
  *(int *)&hasher->privat = iVar33 + -2;
  *(int *)((long)&hasher->privat + 4) = iVar33 + 2;
  *(int *)((long)&hasher->privat + 8) = iVar33 + -3;
  *(int *)((long)&hasher->privat + 0xc) = iVar33 + 3;
  uVar1 = position + num_bytes;
  uVar5 = (position - 4) + num_bytes;
  lVar3 = position - 1;
  uVar26 = lVar41 + position;
  local_b8 = last_insert_len;
LAB_00118154:
LAB_00118168:
  uVar32 = position;
  if (uVar1 <= uVar32 + 4) {
    *(ulong *)dist_cache = (uVar47 + uVar1) - uVar32;
    *(long *)commands = *(long *)commands + ((long)local_b8 - (long)last_insert_len >> 4);
    return;
  }
  local_118 = uVar1 - uVar32;
  uVar17 = uVar16;
  if (uVar32 < uVar16) {
    uVar17 = uVar32;
  }
  local_e8 = lVar10 + uVar32;
  if (uVar16 <= lVar10 + uVar32) {
    local_e8 = uVar16;
  }
  uVar25 = *(ulong *)(literal_context_lut + 0x50);
  lVar30 = *(long *)&params[7].dist.alphabet_size_max;
  uVar38 = uVar32 & ringbuffer_mask;
  piVar2 = (int *)(ringbuffer + uVar38);
  uVar13 = (uint)(*(int *)(ringbuffer + uVar38) * 0x1e35a7bd) >> 0x11;
  uVar40 = (ulong)uVar13;
  psVar46 = *(size_t **)backward_references;
  psVar42 = num_literals + (long)psVar46 * 2;
  do {
    bVar53 = back_refs_position == (size_t *)0x0;
    if (back_refs_position <= psVar46) {
LAB_001182b4:
      uVar27 = (ulong)((uint)local_118 & 7);
      uVar18 = 0x7e4;
      uVar31 = 0;
      uVar50 = 0;
      lVar19 = 0;
      local_108 = 0;
      do {
        if (lVar19 == 0x10) {
          uVar37 = uVar13 & 0x1ff;
          lVar19._0_4_ = params[7].dist.distance_postfix_bits;
          lVar19._4_4_ = params[7].dist.num_direct_distance_codes;
          uVar34 = uVar32 - *(uint *)(lVar30 + uVar40 * 4);
          uVar7 = *(ushort *)(lVar30 + 0x20000 + uVar40 * 2);
          lVar51 = lVar30 + 0x40000 + (ulong)(uVar37 << 0xb);
          uVar48 = 0;
          uVar44 = uVar34;
          uVar36 = uVar7;
          uVar43 = local_108;
          do {
            local_108 = uVar43;
            local_180 = uVar50;
            local_d8 = uVar31;
            local_138 = uVar18;
            do {
              do {
                do {
                  do {
                    bVar52 = lVar19 == 0;
                    lVar19 = lVar19 + -1;
                    if ((bVar52) || (uVar48 = uVar48 + uVar44, uVar17 < uVar48)) {
                      uVar36 = *(ushort *)((long)&(params->hasher).block_bits + (ulong)uVar37 * 2);
                      *(ushort *)((long)&(params->hasher).block_bits + (ulong)uVar37 * 2) =
                           uVar36 + 1;
                      uVar37 = uVar36 & 0x1ff;
                      *(char *)(lVar30 + 0x30000 + (uVar32 & 0xffff)) = (char)uVar13;
                      if (0xfffe < uVar34) {
                        uVar34 = 0xffff;
                      }
                      *(short *)(lVar51 + (ulong)uVar37 * 4) = (short)uVar34;
                      *(ushort *)(lVar51 + 2 + (ulong)uVar37 * 4) = uVar7;
                      *(int *)(lVar30 + uVar40 * 4) = (int)uVar32;
                      *(short *)(lVar30 + 0x20000 + uVar40 * 2) = (short)uVar37;
                      if (local_138 != 0x7e4) {
                        iVar15 = 0;
                        bVar52 = true;
                        goto LAB_00118895;
                      }
                      if (!bVar53) {
                        psVar46 = *(size_t **)backward_references;
                        goto LAB_001188ba;
                      }
                      sVar11 = params[7].dist.max_distance;
                      uVar17 = *(ulong *)(sVar11 + 8);
                      local_170 = *(ulong *)(sVar11 + 0x10);
                      bVar53 = true;
                      if (local_170 < uVar17 >> 7) goto LAB_001189c1;
                      uVar40 = (ulong)((uint)(*piVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                      lVar30 = *(long *)(literal_context_lut + 0x78);
                      local_138 = 0x7e4;
                      iVar15 = 0;
                      lVar19 = 0;
                      goto LAB_001186dc;
                    }
                    uVar18 = (ulong)uVar36;
                    uVar36 = *(ushort *)(lVar51 + 2 + uVar18 * 4);
                    uVar44 = (ulong)*(ushort *)(lVar51 + uVar18 * 4);
                  } while (ringbuffer_mask < local_108 + uVar38);
                  uVar18 = uVar32 - uVar48 & ringbuffer_mask;
                } while ((ringbuffer_mask < uVar18 + local_108) ||
                        (ringbuffer[local_108 + uVar38] != ringbuffer[uVar18 + local_108]));
                uVar31 = 0;
                lVar39 = 0;
LAB_00118514:
                uVar43 = local_118 & 0xfffffffffffffff8;
                uVar49 = uVar27;
                if (local_118 >> 3 == uVar31) {
                  for (; (uVar50 = local_118, uVar49 != 0 &&
                         (uVar50 = uVar43,
                         ringbuffer[uVar43 + uVar18] == *(uint8_t *)((long)piVar2 + uVar43)));
                      uVar43 = uVar43 + 1) {
                    uVar49 = uVar49 - 1;
                  }
                }
                else {
                  if (*(ulong *)(piVar2 + uVar31 * 2) ==
                      *(ulong *)(ringbuffer + uVar31 * 8 + uVar18)) goto code_r0x00118531;
                  uVar31 = *(ulong *)(ringbuffer + uVar31 * 8 + uVar18) ^
                           *(ulong *)(piVar2 + uVar31 * 2);
                  uVar18 = 0;
                  if (uVar31 != 0) {
                    for (; (uVar31 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                    }
                  }
                  uVar50 = (uVar18 >> 3 & 0x1fffffff) - lVar39;
                }
                if ((psVar46 < back_refs_position) && ((ulong)(long)(int)*psVar42 < uVar32 + uVar50)
                   ) {
                  uVar50 = (long)(int)*psVar42 - uVar32;
                }
              } while (uVar50 < 4);
              iVar15 = 0x1f;
              if ((uint)uVar48 != 0) {
                for (; (uint)uVar48 >> iVar15 == 0; iVar15 = iVar15 + -1) {
                }
              }
              uVar18 = (ulong)(iVar15 * -0x1e + 0x780) + uVar50 * 0x87;
              uVar31 = uVar48;
              uVar43 = uVar50;
            } while (uVar18 <= local_138);
          } while( true );
        }
        uVar43 = (ulong)*(int *)((long)&(hasher->common).extra + lVar19 * 4);
        uVar44 = uVar32 - uVar43;
        if ((((lVar19 == 0) || (*(char *)(lVar30 + 0x30000 + (uVar44 & 0xffff)) == (char)uVar13)) &&
            (uVar43 <= uVar17)) && (uVar44 < uVar32)) {
          uVar34 = 0;
          lVar51 = 0;
LAB_00118351:
          uVar48 = local_118 & 0xfffffffffffffff8;
          uVar49 = uVar27;
          if (local_118 >> 3 == uVar34) {
            for (; (uVar34 = local_118, uVar49 != 0 &&
                   (uVar34 = uVar48,
                   ringbuffer[uVar48 + (uVar44 & ringbuffer_mask)] ==
                   *(uint8_t *)((long)piVar2 + uVar48))); uVar48 = uVar48 + 1) {
              uVar49 = uVar49 - 1;
            }
          }
          else {
            if (*(ulong *)(piVar2 + uVar34 * 2) ==
                *(ulong *)(ringbuffer + uVar34 * 8 + (uVar44 & ringbuffer_mask)))
            goto code_r0x0011836e;
            uVar34 = *(ulong *)(ringbuffer + uVar34 * 8 + (uVar44 & ringbuffer_mask)) ^
                     *(ulong *)(piVar2 + uVar34 * 2);
            uVar44 = 0;
            if (uVar34 != 0) {
              for (; (uVar34 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
              }
            }
            uVar34 = (uVar44 >> 3 & 0x1fffffff) - lVar51;
          }
          if ((psVar46 < back_refs_position) && ((ulong)(long)(int)*psVar42 < uVar34 + uVar32)) {
            uVar34 = (long)(int)*psVar42 - uVar32;
          }
          if ((1 < uVar34) && (uVar44 = uVar34 * 0x87 + 0x78f, uVar18 < uVar44)) {
            if (lVar19 != 0) {
              uVar44 = uVar44 - ((0x1ca10U >> ((byte)lVar19 & 0xe) & 0xe) + 0x27);
            }
            if (uVar18 < uVar44) {
              uVar18 = uVar44;
              uVar31 = uVar43;
              uVar50 = uVar34;
              local_108 = uVar34;
            }
          }
        }
        lVar19 = lVar19 + 1;
      } while( true );
    }
    if (uVar32 <= (ulong)(long)(int)*psVar42) {
      if (uVar32 == (long)(int)*psVar42) {
        uVar13 = (uint)psVar42[1];
        local_d8 = (ulong)(int)uVar13;
        if ((uVar32 <= uVar32 - local_d8) || (*(uint *)((long)psVar42 + 0xc) < uVar13))
        goto LAB_001188ba;
        uVar25 = uVar32 - local_d8 & ringbuffer_mask;
        uVar17 = local_118 & 0xfffffffffffffff8;
        uVar40 = 0;
        lVar30 = 0;
        goto LAB_0011827f;
      }
      bVar53 = false;
      goto LAB_001182b4;
    }
    psVar46 = (size_t *)((long)psVar46 + 1);
    *(size_t **)backward_references = psVar46;
    psVar42 = psVar42 + 2;
  } while( true );
LAB_001186dc:
  if (lVar19 == 2) goto LAB_00118b67;
  uVar17 = uVar17 + 1;
  *(ulong *)(sVar11 + 8) = uVar17;
  bVar23 = *(byte *)(lVar30 + uVar40);
  uVar38 = (ulong)bVar23;
  if ((uVar38 != 0) && (uVar38 <= local_118)) {
    uVar50 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar40 * 2);
    lVar51 = *(long *)(literal_context_lut + 0x58);
    lVar39 = uVar50 * uVar38 + *(long *)(lVar51 + 0xa8) +
             (ulong)*(uint *)(lVar51 + 0x20 + uVar38 * 4);
    uVar18 = (ulong)(bVar23 & 0xfffffff8);
    uVar31 = 0;
LAB_00118743:
    if (uVar18 == uVar31) {
      uVar27 = (ulong)(bVar23 & 7);
      pcVar28 = (char *)(lVar39 + uVar31);
      for (; (bVar53 = uVar27 != 0, uVar27 = uVar27 - 1, uVar31 = uVar38, bVar53 &&
             (uVar31 = uVar18, *(char *)((long)piVar2 + uVar18) == *pcVar28)); uVar18 = uVar18 + 1)
      {
        pcVar28 = pcVar28 + 1;
      }
    }
    else {
      uVar27 = *(ulong *)(lVar39 + uVar31);
      if (uVar27 == *(ulong *)((long)piVar2 + uVar31)) goto code_r0x00118761;
      uVar27 = *(ulong *)((long)piVar2 + uVar31) ^ uVar27;
      uVar18 = 0;
      if (uVar27 != 0) {
        for (; (uVar27 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
        }
      }
      uVar31 = (uVar18 >> 3 & 0x1fffffff) + uVar31;
    }
    if (((uVar31 != 0) && (uVar38 < *(uint *)(literal_context_lut + 100) + uVar31)) &&
       (uVar38 = ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                                ((char)(uVar38 - uVar31) * '\x06' & 0x3fU)) & 0x3f) +
                  (uVar38 - uVar31) * 4 << (*(byte *)(lVar51 + uVar38) & 0x3f)) +
                 uVar50 + local_e8 + 1, uVar38 <= uVar25)) {
      iVar33 = 0x1f;
      if ((uint)uVar38 != 0) {
        for (; (uint)uVar38 >> iVar33 == 0; iVar33 = iVar33 + -1) {
        }
      }
      uVar18 = (uVar31 * 0x87 - (ulong)(uint)(iVar33 * 0x1e)) + 0x780;
      if (local_138 <= uVar18) {
        iVar15 = (uint)bVar23 - (int)uVar31;
        local_170 = local_170 + 1;
        *(ulong *)(sVar11 + 0x10) = local_170;
        local_138 = uVar18;
        local_180 = uVar31;
        local_d8 = uVar38;
      }
    }
  }
  lVar19 = lVar19 + 1;
  uVar40 = uVar40 + 1;
  goto LAB_001186dc;
LAB_00118b67:
  bVar53 = true;
  bVar52 = true;
  goto LAB_00118895;
code_r0x00118761:
  uVar31 = uVar31 + 8;
  goto LAB_00118743;
code_r0x00118531:
  lVar39 = lVar39 + -8;
  uVar31 = uVar31 + 1;
  goto LAB_00118514;
code_r0x0011836e:
  lVar51 = lVar51 + -8;
  uVar34 = uVar34 + 1;
  goto LAB_00118351;
LAB_0011827f:
  if (local_118 >> 3 == uVar40) goto LAB_00118c0b;
  if (*(ulong *)(piVar2 + uVar40 * 2) != *(ulong *)(ringbuffer + uVar40 * 8 + uVar25)) {
    uVar25 = *(ulong *)(ringbuffer + uVar40 * 8 + uVar25) ^ *(ulong *)(piVar2 + uVar40 * 2);
    uVar17 = 0;
    if (uVar25 != 0) {
      for (; (uVar25 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
      }
    }
    uVar38 = (uVar17 >> 3 & 0x1fffffff) - lVar30;
    goto LAB_00118b98;
  }
  lVar30 = lVar30 + -8;
  uVar40 = uVar40 + 1;
  goto LAB_0011827f;
LAB_00118c0b:
  uVar40 = (ulong)((uint)local_118 & 7);
  for (; (bVar53 = uVar40 != 0, uVar40 = uVar40 - 1, uVar38 = local_118, bVar53 &&
         (uVar38 = uVar17, ringbuffer[uVar17 + uVar25] == *(uint8_t *)((long)piVar2 + uVar17)));
      uVar17 = uVar17 + 1) {
  }
LAB_00118b98:
  local_180 = (long)*(int *)((long)psVar42 + 4);
  if (uVar38 < (ulong)(long)*(int *)((long)psVar42 + 4)) {
    local_180 = uVar38;
  }
  iVar15 = 0x1f;
  if (uVar13 != 0) {
    for (; uVar13 >> iVar15 == 0; iVar15 = iVar15 + -1) {
    }
  }
  local_138 = (ulong)(iVar15 * -0x1e + 0x780) + local_180 * 0x87;
  bVar53 = false;
  bVar52 = false;
  iVar15 = 0;
LAB_00118895:
  if (0x7e4 < local_138) goto LAB_00118c3b;
LAB_001189c1:
  uVar47 = uVar47 + 1;
  position = uVar32 + 1;
  if (bVar53 && uVar26 < position) {
    if (uVar26 + (uint)((int)lVar41 * 4) < position) {
      uVar17 = uVar32 + 0x11;
      if (uVar5 <= uVar32 + 0x11) {
        uVar17 = uVar5;
      }
      for (; position < uVar17; position = position + 4) {
        lVar30 = *(long *)&params[7].dist.alphabet_size_max;
        uVar13 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
        uVar32 = (ulong)uVar13;
        uVar37 = uVar13 & 0x1ff;
        uVar7 = *(ushort *)((long)&(params->hasher).block_bits + (ulong)uVar37 * 2);
        *(ushort *)((long)&(params->hasher).block_bits + (ulong)uVar37 * 2) = uVar7 + 1;
        lVar19 = (ulong)(uVar37 << 0xb) + lVar30;
        uVar37 = uVar7 & 0x1ff;
        uVar25 = position - *(uint *)(lVar30 + uVar32 * 4);
        *(char *)(lVar30 + 0x30000 + (position & 0xffff)) = (char)uVar13;
        if (0xfffe < uVar25) {
          uVar25 = 0xffff;
        }
        *(short *)(lVar19 + 0x40000 + (ulong)uVar37 * 4) = (short)uVar25;
        *(undefined2 *)(lVar19 + 0x40002 + (ulong)uVar37 * 4) =
             *(undefined2 *)(lVar30 + 0x20000 + uVar32 * 2);
        *(int *)(lVar30 + uVar32 * 4) = (int)position;
        *(short *)(lVar30 + 0x20000 + uVar32 * 2) = (short)uVar37;
        uVar47 = uVar47 + 4;
      }
    }
    else {
      uVar17 = uVar32 + 9;
      if (uVar4 <= uVar32 + 9) {
        uVar17 = uVar4;
      }
      for (; position < uVar17; position = position + 2) {
        lVar30 = *(long *)&params[7].dist.alphabet_size_max;
        uVar13 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
        uVar32 = (ulong)uVar13;
        uVar37 = uVar13 & 0x1ff;
        uVar7 = *(ushort *)((long)&(params->hasher).block_bits + (ulong)uVar37 * 2);
        *(ushort *)((long)&(params->hasher).block_bits + (ulong)uVar37 * 2) = uVar7 + 1;
        lVar19 = (ulong)(uVar37 << 0xb) + lVar30;
        uVar37 = uVar7 & 0x1ff;
        uVar25 = position - *(uint *)(lVar30 + uVar32 * 4);
        *(char *)(lVar30 + 0x30000 + (position & 0xffff)) = (char)uVar13;
        if (0xfffe < uVar25) {
          uVar25 = 0xffff;
        }
        *(short *)(lVar19 + 0x40000 + (ulong)uVar37 * 4) = (short)uVar25;
        *(undefined2 *)(lVar19 + 0x40002 + (ulong)uVar37 * 4) =
             *(undefined2 *)(lVar30 + 0x20000 + uVar32 * 2);
        *(int *)(lVar30 + uVar32 * 4) = (int)position;
        *(short *)(lVar30 + 0x20000 + uVar32 * 2) = (short)uVar37;
        uVar47 = uVar47 + 2;
      }
    }
  }
  goto LAB_00118168;
LAB_001188ba:
  if ((psVar46 < back_refs_position) && (uVar32 == (long)(int)num_literals[(long)psVar46 * 2])) {
    uVar13 = (uint)num_literals[(long)psVar46 * 2 + 1];
    local_d8 = (ulong)(int)uVar13;
    if (*(int *)((long)num_literals + (long)psVar46 * 0x10 + 0xc) < (int)uVar13) {
      uVar37 = *(uint *)((long)num_literals + (long)psVar46 * 0x10 + 4);
      uVar25 = (ulong)uVar37;
      if (uVar37 - 4 < 0x15 && (int)uVar13 < 0x7ffffffd) {
        uVar24 = ~(uint)uVar17 + uVar13;
        lVar30 = *(long *)(literal_context_lut + 0x58);
        iVar15 = (int)uVar24 >> (*(byte *)(lVar30 + uVar25) & 0x1f);
        if (iVar15 < *(int *)(literal_context_lut + 0x60)) {
          uVar9 = *(uint *)(lVar30 + 0x20 + uVar25 * 4);
          uVar8 = kBitMask[*(byte *)(lVar30 + uVar25)];
          lVar30 = *(long *)(lVar30 + 0xa8);
          pBVar21 = BrotliGetTransforms();
          puVar22 = (uint8_t *)malloc(uVar25 * 10);
          iVar15 = BrotliTransformDictionaryWord
                             (puVar22,(uint8_t *)
                                      ((ulong)uVar9 + lVar30 +
                                      (long)(int)((uVar24 & uVar8) * uVar37)),uVar37,pBVar21,iVar15)
          ;
          local_180 = (ulong)iVar15;
          iVar33 = bcmp(piVar2,puVar22,local_180);
          if (iVar33 != 0) {
            bVar53 = false;
            goto LAB_001189c1;
          }
          iVar33 = 0x1f;
          if (uVar13 != 0) {
            for (; uVar13 >> iVar33 == 0; iVar33 = iVar33 + -1) {
            }
          }
          local_138 = (ulong)(iVar33 * -0x1e + 0x780) + local_180 * 0x87;
          iVar15 = uVar37 - iVar15;
          bVar53 = false;
          bVar52 = false;
          goto LAB_00118895;
        }
      }
    }
  }
  bVar53 = false;
  goto LAB_001189c1;
LAB_00118c3b:
  local_160 = local_180;
  if (bVar52) {
    uVar26 = (lVar3 + num_bytes) - uVar32;
    uVar13 = 0;
    local_f0 = uVar26;
LAB_00118c7b:
    uVar25 = (ulong)((uint)uVar26 & 7);
    uVar17 = uVar26 >> 3;
    local_118 = local_118 - 1;
    local_110 = local_180 - 1;
    if (local_118 <= local_180 - 1) {
      local_110 = local_118;
    }
    if (4 < *(int *)(literal_context_lut + 4)) {
      local_110 = 0;
    }
    uVar40 = uVar32 + 1;
    uVar38 = uVar16;
    if (uVar40 < uVar16) {
      uVar38 = uVar40;
    }
    local_e8 = lVar10 + uVar32 + 1;
    if (uVar16 <= local_e8) {
      local_e8 = uVar16;
    }
    uVar18 = *(ulong *)(literal_context_lut + 0x50);
    lVar30 = *(long *)&params[7].dist.alphabet_size_max;
    uVar31 = uVar40 & ringbuffer_mask;
    piVar2 = (int *)(ringbuffer + uVar31);
    uVar37 = (uint)(*(int *)(ringbuffer + uVar31) * 0x1e35a7bd) >> 0x11;
    uVar50 = (ulong)uVar37;
    psVar46 = *(size_t **)backward_references;
    psVar42 = num_literals + (long)psVar46 * 2;
    do {
      if (back_refs_position <= psVar46) {
LAB_00118d8a:
        uVar43 = 0x7e4;
        uVar44 = 0;
        local_100 = 0;
        lVar19 = 0;
        do {
          if (lVar19 == 0x10) {
            uVar24 = uVar37 & 0x1ff;
            lVar51._0_4_ = params[7].dist.distance_postfix_bits;
            lVar51._4_4_ = params[7].dist.num_direct_distance_codes;
            uVar35 = uVar40 - *(uint *)(lVar30 + uVar50 * 4);
            uVar7 = *(ushort *)(lVar30 + 0x20000 + uVar50 * 2);
            lVar19 = lVar30 + 0x40000 + (ulong)(uVar24 << 0xb);
            uVar49 = 0;
            uVar34 = uVar35;
            uVar36 = uVar7;
            uVar48 = local_110;
            do {
              local_110 = uVar48;
              local_160 = local_100;
              uVar20 = uVar43;
              uVar27 = uVar44;
              do {
                do {
                  do {
                    do {
                      bVar52 = lVar51 == 0;
                      lVar51 = lVar51 + -1;
                      if ((bVar52) || (uVar49 = uVar49 + uVar34, uVar38 < uVar49)) {
                        uVar36 = *(ushort *)((long)&(params->hasher).block_bits + (ulong)uVar24 * 2)
                        ;
                        *(ushort *)((long)&(params->hasher).block_bits + (ulong)uVar24 * 2) =
                             uVar36 + 1;
                        uVar24 = uVar36 & 0x1ff;
                        if (0xfffe < uVar35) {
                          uVar35 = 0xffff;
                        }
                        *(char *)(lVar30 + 0x30000 + (uVar40 & 0xffff)) = (char)uVar37;
                        *(short *)(lVar19 + (ulong)uVar24 * 4) = (short)uVar35;
                        *(ushort *)(lVar19 + 2 + (ulong)uVar24 * 4) = uVar7;
                        *(int *)(lVar30 + uVar50 * 4) = (int)uVar40;
                        *(short *)(lVar30 + 0x20000 + uVar50 * 2) = (short)uVar24;
                        iVar33 = 0;
                        if (uVar20 != 0x7e4) goto LAB_0011923b;
                        if (!bVar53) {
                          psVar46 = *(size_t **)backward_references;
                          goto LAB_001191fe;
                        }
                        sVar11 = params[7].dist.max_distance;
                        uVar17 = *(ulong *)(sVar11 + 8);
                        local_e0 = *(ulong *)(sVar11 + 0x10);
                        uVar20 = 0x7e4;
                        if (local_e0 < uVar17 >> 7) goto LAB_0011923b;
                        uVar25 = (ulong)((uint)(*piVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                        lVar30 = *(long *)(literal_context_lut + 0x78);
                        uVar20 = 0x7e4;
                        iVar33 = 0;
                        lVar19 = 0;
                        goto LAB_0011930a;
                      }
                      uVar44 = (ulong)uVar36;
                      uVar36 = *(ushort *)(lVar19 + 2 + uVar44 * 4);
                      uVar34 = (ulong)*(ushort *)(lVar19 + uVar44 * 4);
                    } while (ringbuffer_mask < local_110 + uVar31);
                    uVar44 = uVar40 - uVar49 & ringbuffer_mask;
                  } while ((ringbuffer_mask < local_110 + uVar44) ||
                          (ringbuffer[local_110 + uVar31] != ringbuffer[local_110 + uVar44]));
                  uVar43 = 0;
                  lVar39 = 0;
LAB_00118ff4:
                  if (uVar17 == uVar43) {
                    uVar43 = uVar25;
                    for (local_100 = -lVar39;
                        (bVar52 = uVar43 != 0, uVar43 = uVar43 - 1, bVar52 &&
                        (ringbuffer[local_100 + uVar44] == *(uint8_t *)((long)piVar2 + local_100)));
                        local_100 = local_100 + 1) {
                    }
                  }
                  else {
                    if (*(ulong *)(piVar2 + uVar43 * 2) ==
                        *(ulong *)(ringbuffer + uVar43 * 8 + uVar44)) goto code_r0x00119011;
                    uVar43 = *(ulong *)(ringbuffer + uVar43 * 8 + uVar44) ^
                             *(ulong *)(piVar2 + uVar43 * 2);
                    uVar44 = 0;
                    if (uVar43 != 0) {
                      for (; (uVar43 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                      }
                    }
                    local_100 = (uVar44 >> 3 & 0x1fffffff) - lVar39;
                  }
                  if ((psVar46 < back_refs_position && !bVar53) &&
                     ((ulong)(long)(int)*psVar42 < local_100 + uVar40)) {
                    local_100 = (long)(int)*psVar42 - uVar40;
                  }
                } while (local_100 < 4);
                iVar33 = 0x1f;
                if ((uint)uVar49 != 0) {
                  for (; (uint)uVar49 >> iVar33 == 0; iVar33 = iVar33 + -1) {
                  }
                }
                uVar43 = (ulong)(iVar33 * -0x1e + 0x780) + local_100 * 0x87;
                uVar44 = uVar49;
                uVar48 = local_100;
              } while (uVar43 <= uVar20);
            } while( true );
          }
          uVar34 = (ulong)*(int *)((long)&(hasher->common).extra + lVar19 * 4);
          uVar27 = uVar40 - uVar34;
          if ((((lVar19 == 0) || (*(char *)(lVar30 + 0x30000 + (uVar27 & 0xffff)) == (char)uVar37))
              && (uVar34 <= uVar38)) && (uVar27 < uVar40)) {
            uVar48 = 0;
            lVar51 = 0;
LAB_00118e13:
            if (uVar17 == uVar48) {
              uVar49 = uVar25;
              for (uVar48 = -lVar51;
                  (bVar52 = uVar49 != 0, uVar49 = uVar49 - 1, bVar52 &&
                  (ringbuffer[uVar48 + (uVar27 & ringbuffer_mask)] ==
                   *(uint8_t *)((long)piVar2 + uVar48))); uVar48 = uVar48 + 1) {
              }
            }
            else {
              if (*(ulong *)(piVar2 + uVar48 * 2) ==
                  *(ulong *)(ringbuffer + uVar48 * 8 + (uVar27 & ringbuffer_mask)))
              goto code_r0x00118e30;
              uVar48 = *(ulong *)(ringbuffer + uVar48 * 8 + (uVar27 & ringbuffer_mask)) ^
                       *(ulong *)(piVar2 + uVar48 * 2);
              uVar27 = 0;
              if (uVar48 != 0) {
                for (; (uVar48 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                }
              }
              uVar48 = (uVar27 >> 3 & 0x1fffffff) - lVar51;
            }
            if ((psVar46 < back_refs_position && !bVar53) &&
               ((ulong)(long)(int)*psVar42 < uVar48 + uVar40)) {
              uVar48 = (long)(int)*psVar42 - uVar40;
            }
            if ((1 < uVar48) && (uVar27 = uVar48 * 0x87 + 0x78f, uVar43 < uVar27)) {
              if (lVar19 != 0) {
                uVar27 = uVar27 - ((0x1ca10U >> ((byte)lVar19 & 0xe) & 0xe) + 0x27);
              }
              if (uVar43 < uVar27) {
                uVar44 = uVar34;
                uVar43 = uVar27;
                local_110 = uVar48;
                local_100 = uVar48;
              }
            }
          }
          lVar19 = lVar19 + 1;
        } while( true );
      }
      if (uVar40 <= (ulong)(long)(int)*psVar42) {
        if (uVar40 == (long)(int)*psVar42 && !bVar53) {
          uVar27 = (ulong)(int)(uint)psVar42[1];
          if ((uVar40 <= uVar40 - uVar27) || (*(uint *)((long)psVar42 + 0xc) < (uint)psVar42[1])) {
            uVar27 = 0;
            local_160 = 0;
LAB_001191fe:
            iVar33 = 0;
            if ((back_refs_position <= psVar46) ||
               (uVar40 != (long)(int)num_literals[(long)psVar46 * 2])) {
LAB_00119236:
              uVar20 = 0x7e4;
              goto LAB_0011923b;
            }
            iVar12 = (int)num_literals[(long)psVar46 * 2 + 1];
            if (iVar12 <= *(int *)((long)num_literals + (long)psVar46 * 0x10 + 0xc))
            goto LAB_00119236;
            uVar13 = *(uint *)((long)num_literals + (long)psVar46 * 0x10 + 4);
            uVar26 = (ulong)uVar13;
            iVar33 = 0;
            if (uVar13 - 4 < 0x15 && iVar12 < 0x7ffffffd) {
              uVar37 = ~(uint)uVar38 + iVar12;
              lVar30 = *(long *)(literal_context_lut + 0x58);
              iVar15 = (int)uVar37 >> (*(byte *)(lVar30 + uVar26) & 0x1f);
              if (iVar15 < *(int *)(literal_context_lut + 0x60)) {
                uVar24 = *(uint *)(lVar30 + 0x20 + uVar26 * 4);
                uVar9 = kBitMask[*(byte *)(lVar30 + uVar26)];
                lVar30 = *(long *)(lVar30 + 0xa8);
                pBVar21 = BrotliGetTransforms();
                puVar22 = (uint8_t *)malloc(uVar26 * 10);
                iVar15 = BrotliTransformDictionaryWord
                                   (puVar22,(uint8_t *)
                                            ((ulong)uVar24 + lVar30 +
                                            (long)(int)((uVar37 & uVar9) * uVar13)),uVar13,pBVar21,
                                    iVar15);
                iVar14 = bcmp(piVar2,puVar22,(long)iVar15);
                iVar33 = 0;
                if (iVar14 == 0) {
                  iVar33 = uVar13 - iVar15;
                  uVar27 = (long)iVar12;
                  local_160 = (long)iVar15;
                }
              }
            }
            goto LAB_00119697;
          }
          uVar26 = uVar40 - uVar27 & ringbuffer_mask;
          uVar32 = 0;
          lVar30 = 0;
          goto LAB_00119549;
        }
        goto LAB_00118d8a;
      }
      psVar46 = (size_t *)((long)psVar46 + 1);
      *(size_t **)backward_references = psVar46;
      psVar42 = psVar42 + 2;
    } while( true );
  }
  goto LAB_0011969c;
LAB_00119549:
  if (uVar17 == uVar32) goto LAB_00119a84;
  if (*(ulong *)(piVar2 + uVar32 * 2) != *(ulong *)(ringbuffer + uVar32 * 8 + uVar26)) {
    uVar32 = *(ulong *)(ringbuffer + uVar32 * 8 + uVar26) ^ *(ulong *)(piVar2 + uVar32 * 2);
    uVar26 = 0;
    if (uVar32 != 0) {
      for (; (uVar32 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
      }
    }
    uVar32 = (uVar26 >> 3 & 0x1fffffff) - lVar30;
    goto LAB_00119582;
  }
  lVar30 = lVar30 + -8;
  uVar32 = uVar32 + 1;
  goto LAB_00119549;
LAB_00119a84:
  uVar17 = (ulong)((byte)local_f0 & 7);
  for (uVar32 = -lVar30;
      (bVar53 = uVar17 != 0, uVar17 = uVar17 - 1, bVar53 &&
      (ringbuffer[uVar32 + uVar26] == *(uint8_t *)((long)piVar2 + uVar32))); uVar32 = uVar32 + 1) {
  }
LAB_00119582:
  local_160 = (long)*(int *)((long)psVar42 + 4);
  if (uVar32 < (ulong)(long)*(int *)((long)psVar42 + 4)) {
    local_160 = uVar32;
  }
  iVar33 = 0;
LAB_00119697:
  uVar32 = uVar40;
  local_d8 = uVar27;
  uVar47 = uVar47 + 1;
  iVar15 = iVar33;
LAB_0011969c:
  if (local_e8 < local_d8) {
LAB_001196ca:
    uStack_190 = local_d8 + 0xf;
  }
  else {
    uVar26 = (ulong)*(int *)&(hasher->common).extra;
    if (local_d8 == uVar26) {
      uStack_190 = 0;
      goto LAB_00119748;
    }
    uVar17 = (ulong)*(int *)((long)&(hasher->common).extra + 4);
    uStack_190 = 1;
    if (local_d8 != uVar17) {
      uVar26 = (local_d8 + 3) - uVar26;
      if (uVar26 < 7) {
        bVar23 = (byte)((int)uVar26 << 2);
        uVar13 = 0x9750468;
      }
      else {
        uVar17 = (local_d8 + 3) - uVar17;
        if (6 < uVar17) {
          uStack_190 = 2;
          if ((local_d8 != (long)(int)(hasher->common).dict_num_lookups) &&
             (uStack_190 = 3,
             local_d8 != (long)*(int *)((long)&(hasher->common).dict_num_lookups + 4)))
          goto LAB_001196ca;
          goto LAB_001196ce;
        }
        bVar23 = (byte)((int)uVar17 << 2);
        uVar13 = 0xfdb1ace;
      }
      uStack_190 = (ulong)(uVar13 >> (bVar23 & 0x1f) & 0xf);
    }
  }
LAB_001196ce:
  if ((local_d8 <= local_e8) && (uStack_190 != 0)) {
    *(int *)((long)&(hasher->common).dict_num_lookups + 4) = (int)(hasher->common).dict_num_lookups;
    pvVar6 = (hasher->common).extra;
    *(void **)((long)&(hasher->common).extra + 4) = pvVar6;
    iVar33 = (int)local_d8;
    *(int *)&(hasher->common).extra = iVar33;
    *(int *)&(hasher->common).dict_num_matches = iVar33 + -1;
    *(int *)((long)&(hasher->common).dict_num_matches + 4) = iVar33 + 1;
    (hasher->common).params.type = iVar33 + -2;
    (hasher->common).params.bucket_bits = iVar33 + 2;
    (hasher->common).params.block_bits = iVar33 + -3;
    (hasher->common).params.hash_len = iVar33 + 3;
    iVar33 = (int)pvVar6;
    (hasher->common).params.num_last_distances_to_check = iVar33 + -1;
    (hasher->common).is_prepared_ = iVar33 + 1;
    *(int *)&hasher->privat = iVar33 + -2;
    *(int *)((long)&hasher->privat + 4) = iVar33 + 2;
    (hasher->privat)._H5.block_size_ = CONCAT44(iVar33 + 3,iVar33 + -3);
  }
LAB_00119748:
  uVar13 = (uint)uVar47;
  *(uint *)local_b8 = uVar13;
  *(uint *)((long)local_b8 + 4) = iVar15 << 0x19 | (uint)local_160;
  uVar26 = (ulong)*(uint *)(literal_context_lut + 0x44) + 0x10;
  uVar37 = 0;
  if (uVar26 <= uStack_190) {
    bVar23 = (byte)*(uint *)(literal_context_lut + 0x40);
    uVar17 = ((4L << (bVar23 & 0x3f)) + (uStack_190 - *(uint *)(literal_context_lut + 0x44))) - 0x10
    ;
    uVar37 = 0x1f;
    uVar24 = (uint)uVar17;
    if (uVar24 != 0) {
      for (; uVar24 >> uVar37 == 0; uVar37 = uVar37 - 1) {
      }
    }
    uVar37 = (uVar37 ^ 0xffffffe0) + 0x1f;
    uVar25 = (ulong)((uVar17 >> ((ulong)uVar37 & 0x3f) & 1) != 0);
    lVar30 = (ulong)uVar37 - (ulong)*(uint *)(literal_context_lut + 0x40);
    uStack_190 = (~(-1 << (bVar23 & 0x1f)) & uVar24) + uVar26 +
                 (uVar25 + lVar30 * 2 + 0xfffe << (bVar23 & 0x3f)) | lVar30 * 0x400;
    uVar37 = (uint)(uVar17 - (uVar25 + 2 << ((byte)uVar37 & 0x3f)) >> (bVar23 & 0x3f));
  }
  *(short *)((long)local_b8 + 0xe) = (short)uStack_190;
  *(uint *)(local_b8 + 1) = uVar37;
  if (5 < uVar47) {
    if (uVar47 < 0x82) {
      uVar13 = 0x1f;
      uVar37 = (uint)(uVar47 - 2);
      if (uVar37 != 0) {
        for (; uVar37 >> uVar13 == 0; uVar13 = uVar13 - 1) {
        }
      }
      uVar13 = (int)(uVar47 - 2 >> ((char)(uVar13 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar13 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (uVar47 < 0x842) {
      uVar37 = 0x1f;
      if (uVar13 - 0x42 != 0) {
        for (; uVar13 - 0x42 >> uVar37 == 0; uVar37 = uVar37 - 1) {
        }
      }
      uVar13 = (uVar37 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar13 = 0x15;
      if (0x1841 < uVar47) {
        uVar13 = (uint)(ushort)(0x17 - (uVar47 < 0x5842));
      }
    }
  }
  uVar37 = iVar15 + (uint)local_160;
  if (uVar37 < 10) {
    uVar24 = uVar37 - 2;
  }
  else if (uVar37 < 0x86) {
    uVar37 = uVar37 - 6;
    uVar24 = 0x1f;
    if (uVar37 != 0) {
      for (; uVar37 >> uVar24 == 0; uVar24 = uVar24 - 1) {
      }
    }
    uVar24 = (uVar37 >> ((char)(uVar24 ^ 0xffffffe0) + 0x1fU & 0x1f)) + (uVar24 ^ 0xffffffe0) * 2 +
             0x42;
  }
  else {
    uVar24 = 0x17;
    if (uVar37 < 0x846) {
      uVar24 = 0x1f;
      if (uVar37 - 0x46 != 0) {
        for (; uVar37 - 0x46 >> uVar24 == 0; uVar24 = uVar24 - 1) {
        }
      }
      uVar24 = (uVar24 ^ 0xffe0) + 0x2c;
    }
  }
  uVar7 = (ushort)uVar24;
  sVar29 = (uVar7 & 7) + ((ushort)uVar13 & 7) * 8;
  if ((((uStack_190 & 0x3ff) == 0) && ((ushort)uVar13 < 8)) && (uVar7 < 0x10)) {
    if (7 < uVar7) {
      sVar29 = sVar29 + 0x40;
    }
  }
  else {
    iVar15 = ((uVar13 & 0xffff) >> 3) * 3 + ((uVar24 & 0xffff) >> 3);
    sVar29 = sVar29 + ((ushort)(0x520d40 >> ((char)iVar15 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar15 * 0x40 + 0x40;
  }
  *(short *)((long)local_b8 + 0xc) = sVar29;
  *num_commands = *num_commands + uVar47;
  position = local_160 + uVar32;
  uVar47 = sVar45;
  if (position < sVar45) {
    uVar47 = position;
  }
  uVar17 = uVar32 + 2;
  if (local_d8 < local_160 >> 2) {
    uVar26 = position + local_d8 * -4;
    if (uVar26 < uVar17) {
      uVar26 = uVar17;
    }
    uVar17 = uVar26;
    if (uVar47 < uVar26) {
      uVar17 = uVar47;
    }
  }
  uVar26 = lVar41 + local_160 * 2 + uVar32;
  local_b8 = local_b8 + 2;
  for (; uVar17 < uVar47; uVar17 = uVar17 + 1) {
    lVar30 = *(long *)&params[7].dist.alphabet_size_max;
    uVar13 = (uint)(*(int *)(ringbuffer + (uVar17 & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
    uVar32 = (ulong)uVar13;
    uVar37 = uVar13 & 0x1ff;
    uVar7 = *(ushort *)((long)&(params->hasher).block_bits + (ulong)uVar37 * 2);
    *(ushort *)((long)&(params->hasher).block_bits + (ulong)uVar37 * 2) = uVar7 + 1;
    lVar19 = (ulong)(uVar37 << 0xb) + lVar30;
    uVar37 = uVar7 & 0x1ff;
    uVar25 = uVar17 - *(uint *)(lVar30 + uVar32 * 4);
    if (0xfffe < uVar25) {
      uVar25 = 0xffff;
    }
    *(char *)(lVar30 + 0x30000 + (uVar17 & 0xffff)) = (char)uVar13;
    *(short *)(lVar19 + 0x40000 + (ulong)uVar37 * 4) = (short)uVar25;
    *(undefined2 *)(lVar19 + 0x40002 + (ulong)uVar37 * 4) =
         *(undefined2 *)(lVar30 + 0x20000 + uVar32 * 2);
    *(int *)(lVar30 + uVar32 * 4) = (int)uVar17;
    *(short *)(lVar30 + 0x20000 + uVar32 * 2) = (short)uVar37;
  }
  uVar47 = 0;
  goto LAB_00118154;
LAB_0011930a:
  if (lVar19 == 2) goto LAB_0011923b;
  uVar17 = uVar17 + 1;
  *(ulong *)(sVar11 + 8) = uVar17;
  bVar23 = *(byte *)(lVar30 + uVar25);
  uVar38 = (ulong)bVar23;
  if ((uVar38 != 0) && (uVar38 <= local_118)) {
    uVar44 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar25 * 2);
    lVar51 = *(long *)(literal_context_lut + 0x58);
    lVar39 = uVar44 * uVar38 + *(long *)(lVar51 + 0xa8) +
             (ulong)*(uint *)(lVar51 + 0x20 + uVar38 * 4);
    uVar31 = (ulong)(bVar23 & 0xfffffff8);
    uVar50 = 0;
LAB_00119384:
    if (uVar31 == uVar50) {
      uVar43 = (ulong)(bVar23 & 7);
      pcVar28 = (char *)(lVar39 + uVar50);
      for (; (bVar52 = uVar43 != 0, uVar43 = uVar43 - 1, uVar50 = uVar38, bVar52 &&
             (uVar50 = uVar31, *(char *)((long)piVar2 + uVar31) == *pcVar28)); uVar31 = uVar31 + 1)
      {
        pcVar28 = pcVar28 + 1;
      }
    }
    else {
      uVar43 = *(ulong *)(lVar39 + uVar50);
      if (uVar43 == *(ulong *)((long)piVar2 + uVar50)) goto code_r0x001193a2;
      uVar43 = *(ulong *)((long)piVar2 + uVar50) ^ uVar43;
      uVar31 = 0;
      if (uVar43 != 0) {
        for (; (uVar43 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
        }
      }
      uVar50 = (uVar31 >> 3 & 0x1fffffff) + uVar50;
    }
    if (((uVar50 != 0) && (uVar38 < *(uint *)(literal_context_lut + 100) + uVar50)) &&
       (uVar38 = ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                                ((char)(uVar38 - uVar50) * '\x06' & 0x3fU)) & 0x3f) +
                  (uVar38 - uVar50) * 4 << (*(byte *)(lVar51 + uVar38) & 0x3f)) +
                 uVar44 + local_e8 + 1, uVar38 <= uVar18)) {
      iVar12 = 0x1f;
      if ((uint)uVar38 != 0) {
        for (; (uint)uVar38 >> iVar12 == 0; iVar12 = iVar12 + -1) {
        }
      }
      uVar31 = (uVar50 * 0x87 - (ulong)(uint)(iVar12 * 0x1e)) + 0x780;
      if (uVar20 <= uVar31) {
        iVar33 = (uint)bVar23 - (int)uVar50;
        local_e0 = local_e0 + 1;
        *(ulong *)(sVar11 + 0x10) = local_e0;
        uVar20 = uVar31;
        local_160 = uVar50;
        uVar27 = uVar38;
      }
    }
  }
  lVar19 = lVar19 + 1;
  uVar25 = uVar25 + 1;
  goto LAB_0011930a;
LAB_0011923b:
  if (uVar20 < local_138 + 0xaf) {
    local_160 = local_180;
    local_e8 = uVar32 + lVar10;
    if (uVar16 <= uVar32 + lVar10) {
      local_e8 = uVar16;
    }
    goto LAB_0011969c;
  }
  uVar17 = uVar47 + 1;
  if (2 < uVar13) goto LAB_00119697;
  uVar13 = uVar13 + 1;
  uVar25 = uVar32 + 5;
  uVar26 = uVar26 - 1;
  local_f0 = (ulong)(byte)((byte)local_f0 + 7);
  local_180 = local_160;
  uVar32 = uVar40;
  local_d8 = uVar27;
  uVar47 = uVar17;
  local_138 = uVar20;
  iVar15 = iVar33;
  if (uVar1 <= uVar25) goto LAB_0011969c;
  goto LAB_00118c7b;
code_r0x001193a2:
  uVar50 = uVar50 + 8;
  goto LAB_00119384;
code_r0x00119011:
  lVar39 = lVar39 + -8;
  uVar43 = uVar43 + 1;
  goto LAB_00118ff4;
code_r0x00118e30:
  lVar51 = lVar51 + -8;
  uVar48 = uVar48 + 1;
  goto LAB_00118e13;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals,
    const BackwardReferenceFromDecoder* backward_references,
    size_t* back_refs_position, size_t back_refs_size) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  BROTLI_UNUSED(literal_context_lut);

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    sr.used_stored = BROTLI_FALSE;
    FN(FindLongestMatch)(privat, &params->dictionary,
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance,
        backward_references, back_refs_position, back_refs_size, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      /* If a reference from backward_references array was found
         then just take it */
      if (!sr.used_stored) {
          for (;; --max_length) {
            const score_t cost_diff_lazy = 175;
            HasherSearchResult sr2;
            sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
                BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
            sr2.len_code_delta = 0;
            sr2.distance = 0;
            sr2.score = kMinScore;
            sr2.used_stored = BROTLI_FALSE;
            max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
            dictionary_start = BROTLI_MIN(size_t,
                position + 1 + position_offset, max_backward_limit);
            FN(FindLongestMatch)(privat,
                &params->dictionary,
                ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
                max_distance, dictionary_start + gap, params->dist.max_distance,
                backward_references, back_refs_position, back_refs_size, &sr2);
            if (sr2.score >= sr.score + cost_diff_lazy || sr2.used_stored) {
              /* Ok, let's just write one byte for now and start a match from the
                 next byte. */
              ++position;
              ++insert_length;
              sr = sr2;
              /* If a reference from backward_references array was found
                 then just take it */
              if (sr2.used_stored) {
                ++delayed_backward_references_in_row;
                break;
              }
              if (++delayed_backward_references_in_row < 4 &&
                  position + FN(HashTypeLength)() < pos_end) {
                continue;
              }
            }
            break;
          }
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics && back_refs_size == 0) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}